

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

void QtPrivate::QDebugStreamOperatorForType<QPainter::RenderHint,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  uint uVar1;
  long in_FS_OFFSET;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (QDebug)dbg->stream;
  uVar1 = *a;
  (local_38.stream)->ref = (local_38.stream)->ref + 2;
  local_28.stream = local_38.stream;
  qt_QMetaEnum_flagDebugOperator
            ((QDebug *)&local_30,(ulonglong)&local_28,(QMetaObject *)(ulong)uVar1,
             (char *)&QPainter::staticMetaObject);
  QDebug::~QDebug(&local_28);
  QDebug::~QDebug(&local_30);
  QDebug::~QDebug(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }